

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void free_arg_list(JSContext *ctx,JSValue *tab,uint32_t len)

{
  JSValue v;
  uint in_EDX;
  JSContext *in_RSI;
  JSValueUnion in_RDI;
  uint32_t i;
  uint uVar1;
  
  for (uVar1 = 0; uVar1 < in_EDX; uVar1 = uVar1 + 1) {
    v.tag._4_4_ = len;
    v.tag._0_4_ = i;
    v.u.float64 = in_RDI.float64;
    JS_FreeValue(in_RSI,v);
  }
  js_free(in_RSI,(void *)CONCAT44(in_EDX,uVar1));
  return;
}

Assistant:

static void free_arg_list(JSContext *ctx, JSValue *tab, uint32_t len)
{
    uint32_t i;
    for(i = 0; i < len; i++) {
        JS_FreeValue(ctx, tab[i]);
    }
    js_free(ctx, tab);
}